

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int __thiscall MlmWrap::sendStream(MlmWrap *this,char *subject,char *picture,__va_list_tag *argptr)

{
  mutex *__mutex;
  int iVar1;
  zmsg_t *pzVar2;
  undefined8 uVar3;
  zmsg_t *msg;
  zmsg_t *local_20;
  
  pzVar2 = czhelp_zmsg_create(picture,argptr);
  local_20 = czhelp_zmsg_create("sssm","STR",subject,picture,pzVar2);
  __mutex = &this->actormutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    iVar1 = zactor_send(this->actor,&local_20);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return iVar1;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

int MlmWrap::sendStream(const char* subject, const char* picture, va_list argptr) {
    int rc = -1;
//    std::cerr << error("sending out stream ") << subject << "\n";
    zmsg_t *body = czhelp_zmsg_create(picture, argptr);
    zmsg_t *msg = czhelp_zmsg_create("sssm", streammsg, subject, picture, body);
    //actual message structure - sssm -- note that the first three strings constitute the header, and the msg the body
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &msg);
    return rc;
}